

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

PluralOperand icu_63::tokenTypeToPluralOperand(tokenType tt)

{
  PluralOperand local_c;
  tokenType tt_local;
  
  switch(tt) {
  case tVariableN:
    local_c = PLURAL_OPERAND_N;
    break;
  case tVariableI:
    local_c = PLURAL_OPERAND_I;
    break;
  case tVariableF:
    local_c = PLURAL_OPERAND_F;
    break;
  case tVariableV:
    local_c = PLURAL_OPERAND_V;
    break;
  case tVariableT:
    local_c = PLURAL_OPERAND_T;
    break;
  default:
    local_c = PLURAL_OPERAND_N;
  }
  return local_c;
}

Assistant:

PluralOperand tokenTypeToPluralOperand(tokenType tt) {
    switch(tt) {
    case tVariableN:
        return PLURAL_OPERAND_N;
    case tVariableI:
        return PLURAL_OPERAND_I;
    case tVariableF:
        return PLURAL_OPERAND_F;
    case tVariableV:
        return PLURAL_OPERAND_V;
    case tVariableT:
        return PLURAL_OPERAND_T;
    default:
        U_ASSERT(FALSE);  // unexpected.
        return PLURAL_OPERAND_N;
    }
}